

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O2

void __thiscall
ParserTest_ComplexComparisonExpr_Test::~ParserTest_ComplexComparisonExpr_Test
          (ParserTest_ComplexComparisonExpr_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTest, ComplexComparisonExpr)
{
  auto node = 
    std::make_unique<BinaryOpNode>(
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(2),
        BinaryOperator::Addition,
        std::make_unique<NumericLiteralNode>(3)),
      BinaryOperator::Greater,
      std::make_unique<NumericLiteralNode>(5));
  setupTest("2 + 3 > 5", &Parser::parseComparisonExpression, std::move(node));

  node = 
    std::make_unique<BinaryOpNode>(  
      std::make_unique<BinaryOpNode>(
        std::make_unique<BinaryOpNode>(
          std::make_unique<NumericLiteralNode>(2),
          BinaryOperator::Addition,
          std::make_unique<NumericLiteralNode>(3)), 
        BinaryOperator::Multiplication,
        std::make_unique<NumericLiteralNode>(4)),
    BinaryOperator::GreaterEq,
     std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(2),
      BinaryOperator::BinaryXor,
      std::make_unique<NumericLiteralNode>(4))); 
  setupTest("(2 + 3) * 4 >= 2 ^ 4", &Parser::parseComparisonExpression, std::move(node));
}